

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  ValueHolder VVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  byte *pbVar5;
  ValueHolder *pVVar6;
  long lVar7;
  undefined8 *puVar8;
  long *plVar9;
  _Elt_pointer ppVVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  byte *pbVar13;
  ValueHolder local_88;
  ulong local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  pbVar5 = (byte *)token->end_;
  cVar2 = *token->start_;
  pbVar13 = (byte *)(token->start_ + (cVar2 == '-'));
  if (pbVar13 == pbVar5) {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x283d4a);
    local_68 = &local_58;
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_58 = *plVar11;
      lStack_50 = plVar9[3];
    }
    else {
      local_58 = *plVar11;
      local_68 = (long *)*plVar9;
    }
    local_60 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_88.string_ = (char *)&local_78;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_78._8_8_ = plVar9[3];
    }
    else {
      local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_88.string_ = (char *)*plVar9;
    }
    local_80 = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    addError(this,(string *)&local_88,token,(Location)0x0);
  }
  else {
    if (pbVar13 < pbVar5) {
      lVar7 = 0;
      do {
        bVar3 = *pbVar13;
        if (9 < (byte)(bVar3 - 0x30)) {
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_48);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x283d4a);
          local_68 = &local_58;
          plVar9 = puVar8 + 2;
          if ((long *)*puVar8 == plVar9) {
            local_58 = *plVar9;
            lStack_50 = puVar8[3];
          }
          else {
            local_58 = *plVar9;
            local_68 = (long *)*puVar8;
          }
          local_60 = puVar8[1];
          *puVar8 = plVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
          local_88.string_ = (char *)&local_78;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar12) {
            local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_78._8_8_ = plVar9[3];
          }
          else {
            local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_88.string_ = (char *)*plVar9;
          }
          local_80 = plVar9[1];
          *plVar9 = (long)paVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          addError(this,(string *)&local_88,token,(Location)0x0);
          goto LAB_001c4d18;
        }
        pbVar13 = pbVar13 + 1;
        lVar7 = (ulong)(bVar3 & 0xf) + lVar7 * 10;
      } while ((pbVar13 < pbVar5) && (lVar7 < 0x100000000));
    }
    else {
      lVar7 = 0;
    }
    if (pbVar13 == pbVar5) {
      if (cVar2 == '-') {
        if (0xfffffffeffffffff < lVar7 - 0x80000001U) {
          local_88.int_ = -(int)lVar7;
          ppVVar10 = (this->nodes_).c.
                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
          if (ppVVar10 ==
              (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVVar10 = (this->nodes_).c.
                       super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          pVVar6 = &ppVVar10[-1]->value_;
          VVar1 = *pVVar6;
          *pVVar6 = local_88;
          uVar4 = *(ushort *)(pVVar6 + 1);
          *(ushort *)(pVVar6 + 1) = (uVar4 & 0xfe00) + 1;
          local_80 = CONCAT62(local_80._2_6_,uVar4) & 0xffffffffffff01ff;
          local_88 = VVar1;
LAB_001c4c00:
          Value::~Value((Value *)&local_88);
          return true;
        }
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_48);
        puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x283d4a)
        ;
        local_68 = &local_58;
        plVar9 = puVar8 + 2;
        if ((long *)*puVar8 == plVar9) {
          local_58 = *plVar9;
          lStack_50 = puVar8[3];
        }
        else {
          local_58 = *plVar9;
          local_68 = (long *)*puVar8;
        }
        local_60 = puVar8[1];
        *puVar8 = plVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_88.string_ = (char *)&local_78;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar12) {
          local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_78._8_8_ = plVar9[3];
        }
        else {
          local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_88.string_ = (char *)*plVar9;
        }
        local_80 = plVar9[1];
        *plVar9 = (long)paVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        addError(this,(string *)&local_88,token,(Location)0x0);
      }
      else {
        if (lVar7 < 0x100000000) {
          if (lVar7 < 0x80000000) {
            local_80 = CONCAT62(local_80._2_6_,1);
          }
          else {
            local_80 = CONCAT62(local_80._2_6_,2);
          }
          local_88.int_ = (int)lVar7;
          ppVVar10 = (this->nodes_).c.
                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
          if (ppVVar10 ==
              (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVVar10 = (this->nodes_).c.
                       super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          Value::swap(ppVVar10[-1],(Value *)&local_88);
          goto LAB_001c4c00;
        }
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_48);
        puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x283d4a)
        ;
        local_68 = &local_58;
        plVar9 = puVar8 + 2;
        if ((long *)*puVar8 == plVar9) {
          local_58 = *plVar9;
          lStack_50 = puVar8[3];
        }
        else {
          local_58 = *plVar9;
          local_68 = (long *)*puVar8;
        }
        local_60 = puVar8[1];
        *puVar8 = plVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_88.string_ = (char *)&local_78;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar12) {
          local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_78._8_8_ = plVar9[3];
        }
        else {
          local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_88.string_ = (char *)*plVar9;
        }
        local_80 = plVar9[1];
        *plVar9 = (long)paVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        addError(this,(string *)&local_88,token,(Location)0x0);
      }
    }
    else {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x283d4a);
      local_68 = &local_58;
      plVar9 = puVar8 + 2;
      if ((long *)*puVar8 == plVar9) {
        local_58 = *plVar9;
        lStack_50 = puVar8[3];
      }
      else {
        local_58 = *plVar9;
        local_68 = (long *)*puVar8;
      }
      local_60 = puVar8[1];
      *puVar8 = plVar9;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_88.string_ = (char *)&local_78;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar12) {
        local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_78._8_8_ = plVar9[3];
      }
      else {
        local_78._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_88.string_ = (char *)*plVar9;
      }
      local_80 = plVar9[1];
      *plVar9 = (long)paVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      addError(this,(string *)&local_88,token,(Location)0x0);
    }
  }
LAB_001c4d18:
  if (local_88 != &local_78) {
    operator_delete(local_88.string_,local_78._M_allocated_capacity + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return false;
}

Assistant:

bool
Reader::decodeNumber ( Token& token )
{
    Location current = token.start_;
    bool isNegative = *current == '-';

    if ( isNegative )
        ++current;

    if (current == token.end_)
    {
        return addError ( "'" + std::string ( token.start_, token.end_ ) +
            "' is not a valid number.", token );
    }

    // The existing Json integers are 32-bit so using a 64-bit value here avoids
    // overflows in the conversion code below.
    std::int64_t value = 0;

    static_assert(sizeof(value) > sizeof(Value::maxUInt),
        "The JSON integer overflow logic will need to be reworked.");

    while (current < token.end_ && (value <= Value::maxUInt))
    {
        Char c = *current++;

        if ( c < '0'  ||  c > '9' )
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' is not a number.", token );
        }

        value = (value * 10) + (c - '0');
    }

    // More tokens left -> input is larger than largest possible return value
    if (current != token.end_)
    {
        return addError ( "'" + std::string ( token.start_, token.end_ ) +
            "' exceeds the allowable range.", token );
    }

    if ( isNegative )
    {
        value = -value;

        if (value < Value::minInt || value > Value::maxInt)
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' exceeds the allowable range.", token );
        }

        currentValue () = static_cast<Value::Int>( value );
    }
    else
    {
        if (value > Value::maxUInt)
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' exceeds the allowable range.", token );
        }

        // If it's representable as a signed integer, construct it as one.
        if ( value <= Value::maxInt )
            currentValue () = static_cast<Value::Int>( value );
        else
            currentValue () = static_cast<Value::UInt>( value );
    }

    return true;
}